

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<char>::emplace_back<char>(SmallVectorBase<char> *this,char *args)

{
  pointer pcVar1;
  reference pcVar2;
  
  if (this->len == this->cap) {
    pcVar1 = emplaceRealloc<char>(this,this->data_ + this->len,args);
    return pcVar1;
  }
  this->data_[this->len] = *args;
  this->len = this->len + 1;
  pcVar2 = back(this);
  return pcVar2;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }